

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

StringRef llvm::sys::path::root_path(StringRef path,Style style)

{
  size_t *this;
  char cVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  path *this_00;
  Style in_R8D;
  path *ppVar6;
  bool bVar7;
  StringRef Suffix;
  StringRef SVar8;
  StringRef path_00;
  undefined1 auStack_98 [8];
  const_iterator pos;
  undefined1 auStack_60 [8];
  const_iterator b;
  
  pcVar5 = (char *)path.Length;
  this_00 = (path *)path.Data;
  path_00.Length._0_4_ = style;
  path_00.Data = pcVar5;
  path_00.Length._4_4_ = 0;
  begin((const_iterator *)auStack_60,this_00,path_00,in_R8D);
  pos.Component.Length = b.Component.Length;
  pos.Position = b.Position;
  pos.Path.Length = b.Path.Length;
  pos.Component.Data = b.Component.Data;
  auStack_98 = auStack_60;
  pos.Path.Data = b.Path.Data;
  if (auStack_60 == (undefined1  [8])this_00) {
    pcVar4 = (char *)0x0;
    ppVar6 = (path *)0x0;
    if ((char *)b.Component.Length == pcVar5) goto LAB_00b63ce4;
  }
  this = &b.Path.Length;
  if ((b.Component.Data < (char *)0x3) ||
     ((cVar1 = StringRef::operator[]((StringRef *)this,0), cVar1 != '/' &&
      (cVar1 != '\\' || style != windows)))) {
    bVar7 = false;
  }
  else {
    cVar1 = StringRef::operator[]((StringRef *)this,1);
    cVar2 = StringRef::operator[]((StringRef *)this,0);
    bVar7 = cVar1 == cVar2;
  }
  if (style == windows) {
    Suffix.Length = 1;
    Suffix.Data = ":";
    bVar3 = StringRef::endswith((StringRef *)this,Suffix);
  }
  else {
    bVar3 = false;
  }
  if ((bVar7 | bVar3) == 1) {
    const_iterator::operator++((const_iterator *)auStack_98);
    if ((auStack_98 != (undefined1  [8])this_00) || ((char *)pos.Component.Length != pcVar5)) {
      cVar1 = StringRef::operator[]((StringRef *)&pos.Path.Length,0);
      if ((cVar1 == '/') || (style == windows && cVar1 == '\\')) {
        pcVar4 = pos.Component.Data + (long)b.Component.Data;
        ppVar6 = this_00;
        if (pcVar5 < pos.Component.Data + (long)b.Component.Data) {
          pcVar4 = pcVar5;
        }
        goto LAB_00b63ce4;
      }
    }
  }
  else {
    cVar1 = StringRef::operator[]((StringRef *)this,0);
    if ((cVar1 != '/') &&
       (pcVar4 = (char *)0x0, ppVar6 = (path *)0x0, style != windows || cVar1 != '\\'))
    goto LAB_00b63ce4;
  }
  pcVar4 = b.Component.Data;
  ppVar6 = (path *)b.Path.Length;
LAB_00b63ce4:
  SVar8.Length = (size_t)pcVar4;
  SVar8.Data = (char *)ppVar6;
  return SVar8;
}

Assistant:

StringRef root_path(StringRef path, Style style) {
  const_iterator b = begin(path, style), pos = b, e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if (has_net || has_drive) {
      if ((++pos != e) && is_separator((*pos)[0], style)) {
        // {C:/,//net/}, so get the first two components.
        return path.substr(0, b->size() + pos->size());
      } else {
        // just {C:,//net}, return the first component.
        return *b;
      }
    }

    // POSIX style root directory.
    if (is_separator((*b)[0], style)) {
      return *b;
    }
  }

  return StringRef();
}